

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiWindow *pIVar1;
  ImRect IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pIVar3 = GImGui;
  if ((((GImGui->CurrentWindow->Appearing == true) &&
       (pIVar1 = GImGui->NavWindow, pIVar1 == GImGui->CurrentWindow->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar3->NavInitResultId = (pIVar1->DC).LastItemId;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = (pIVar1->Pos).x;
    auVar5._4_4_ = (pIVar1->Pos).y;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = (pIVar1->DC).LastItemRect.Min.x;
    auVar6._4_4_ = (pIVar1->DC).LastItemRect.Min.y;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = (pIVar1->DC).LastItemRect.Max.x;
    auVar7._4_4_ = (pIVar1->DC).LastItemRect.Max.y;
    auVar6 = vsubps_avx(auVar6,auVar5);
    auVar5 = vsubps_avx(auVar7,auVar5);
    IVar2 = (ImRect)vmovlhps_avx(auVar6,auVar5);
    pIVar3->NavInitResultRectRel = IVar2;
    pIVar3->NavAnyRequest = pIVar3->NavMoveRequest;
    bVar4 = IsItemVisible();
    if (!bVar4) {
      SetScrollHereY(0.5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}